

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::UnitTest::Failed(UnitTest *this)

{
  UnitTestImpl *this_00;
  bool bVar1;
  int iVar2;
  
  this_00 = this->impl_;
  iVar2 = internal::UnitTestImpl::failed_test_case_count(this_00);
  if (0 < iVar2) {
    return true;
  }
  bVar1 = TestResult::Failed(&this_00->ad_hoc_test_result_);
  return bVar1;
}

Assistant:

AssertionResult CmpHelperSTRCASENE(const char* s1_expression,
                                   const char* s2_expression,
                                   const char* s1,
                                   const char* s2) {
  if (!String::CaseInsensitiveCStringEquals(s1, s2)) {
    return AssertionSuccess();
  } else {
    return AssertionFailure()
        << "Expected: (" << s1_expression << ") != ("
        << s2_expression << ") (ignoring case), actual: \""
        << s1 << "\" vs \"" << s2 << "\"";
  }
}